

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::Extend(ON_NurbsCurve *this,ON_Interval *domain)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int order;
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  int local_5c;
  undefined1 auStack_58 [4];
  int i_1;
  double local_50;
  int local_44;
  undefined1 auStack_40 [4];
  int i;
  byte local_2d;
  int local_2c;
  int iStack_28;
  bool changed;
  int cvdim;
  int dim;
  bool is_rat;
  ON_Interval *domain_local;
  ON_NurbsCurve *this_local;
  
  _dim = domain;
  domain_local = (ON_Interval *)this;
  uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((uVar2 & 1) == 0) {
    bVar1 = IsRational(this);
    cvdim._3_1_ = -bVar1 & 1;
    iStack_28 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
    local_2c = iStack_28 + (uint)(cvdim._3_1_ & 1);
    local_2d = 0;
    dVar9 = ON_Interval::operator[](_dim,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    pdVar7 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
    if (dVar9 < *pdVar7) {
      ClampEnd(this,0);
      iVar4 = local_2c;
      iVar3 = Order(this);
      iVar6 = this->m_cv_stride;
      pdVar8 = CV(this,0);
      pdVar7 = this->m_knot;
      dVar9 = ON_Interval::operator[](_dim,0);
      ON_EvaluateNurbsDeBoor(iVar4,iVar3,iVar6,pdVar8,pdVar7,1,0.0,dVar9);
      local_44 = 0;
      while( true ) {
        iVar6 = local_44;
        iVar4 = Order(this);
        if (iVar4 + -1 <= iVar6) break;
        dVar10 = ON_Interval::operator[](_dim,0);
        this->m_knot[local_44] = dVar10;
        local_44 = local_44 + 1;
      }
      local_2d = 1;
    }
    dVar10 = ON_Interval::operator[](_dim,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    local_50 = dVar9;
    pdVar7 = ON_Interval::operator[]((ON_Interval *)auStack_58,1);
    if (*pdVar7 <= dVar10 && dVar10 != *pdVar7) {
      ClampEnd(this,1);
      iVar3 = CVCount(this);
      iVar5 = Order(this);
      iVar4 = local_2c;
      order = Order(this);
      iVar6 = this->m_cv_stride;
      pdVar8 = CV(this,iVar3 - iVar5);
      pdVar7 = this->m_knot;
      dVar9 = ON_Interval::operator[](_dim,1);
      ON_EvaluateNurbsDeBoor(iVar4,order,iVar6,pdVar8,pdVar7 + (iVar3 - iVar5),-1,0.0,dVar9);
      local_5c = KnotCount(this);
      while( true ) {
        local_5c = local_5c + -1;
        iVar6 = CVCount(this);
        if (local_5c < iVar6 + -1) break;
        dVar9 = ON_Interval::operator[](_dim,1);
        this->m_knot[local_5c] = dVar9;
      }
      local_2d = 1;
    }
    if ((local_2d & 1) != 0) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    }
    this_local._7_1_ = (bool)(local_2d & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::Extend(
  const ON_Interval& domain
  )

{
  if (IsClosed()) return false;
  bool is_rat = IsRational() ? true : false;
  int dim = Dimension();
  int cvdim = dim+is_rat;

  bool changed = false;
  if (domain[0] < Domain()[0]){
    ClampEnd(0);
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(0),m_knot,1,0.0,domain[0]);
    for (int i = 0; i < Order()-1; i++)
			m_knot[i] = domain[0];
    changed = true;
  }
  if (domain[1] > Domain()[1]){
    ClampEnd(1);
    int i = CVCount() - Order();
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(i),m_knot + i,-1,0.0,domain[1]);
    for (i = KnotCount()-1; i >= CVCount()-1; i--)
			m_knot[i] = domain[1];
    changed = true;
  }

  if (changed){
    DestroyCurveTree();
  }
  return changed;
}